

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void __thiscall TestMaterial::TestPrecision(TestMaterial *this)

{
  ostream *poVar1;
  reference pvVar2;
  double *pdVar3;
  reference pvVar4;
  clock_t cVar5;
  size_t sVar6;
  S_Object *pSVar7;
  clock_t cVar8;
  double dVar9;
  Scalar distance;
  Point3 p2;
  Point3 p1;
  uint j_1;
  uint k;
  size_t j;
  long i_1;
  long i;
  clock_t end;
  clock_t begin;
  undefined1 local_58 [8];
  vector<double,_std::allocator<double>_> angle;
  allocator<CD_Matrix::Vector3T<double,_false>_> local_29;
  undefined1 local_28 [8];
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  axe;
  TestMaterial *this_local;
  
  axe.
  super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  poVar1 = std::operator<<((ostream *)&std::cout,"TestPrecision");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::allocator<CD_Matrix::Vector3T<double,_false>_>::allocator(&local_29);
  std::
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>::
  vector((vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
          *)local_28,10000,&local_29);
  std::allocator<CD_Matrix::Vector3T<double,_false>_>::~allocator(&local_29);
  std::allocator<double>::allocator((allocator<double> *)((long)&begin + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_58,10000,
             (allocator<double> *)((long)&begin + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&begin + 7));
  std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),0x12);
  sch::CD_Scene::sceneProximityQuery();
  display();
  for (i_1 = 0; i_1 < 10000; i_1 = i_1 + 1) {
    dVar9 = sin(0.0006000000000000001);
    dVar9 = sin(dVar9 * 42.0 *
                (double)((i_1 + (i_1 / 0x57) * -0x57 + (i_1 / -0x5200000000000000) * 0x57) % 3));
    pvVar2 = std::
             vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
             ::operator[]((vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                           *)local_28,i_1);
    pdVar3 = CD_Matrix::Vector3T<double,_false>::operator[](pvVar2,0);
    *pdVar3 = dVar9;
    dVar9 = sin(0.0006000000000000001);
    dVar9 = sin(dVar9 * -43.0 * (double)((i_1 % 0x49) % 3));
    pvVar2 = std::
             vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
             ::operator[]((vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                           *)local_28,i_1);
    pdVar3 = CD_Matrix::Vector3T<double,_false>::operator[](pvVar2,1);
    *pdVar3 = dVar9;
    dVar9 = sin(0.00030000000000000003);
    dVar9 = cos(dVar9 * 83.0 *
                (double)((i_1 + (i_1 / 0x59) * -0x59 + (i_1 / -0x4e00000000000000) * 0x59) % 3));
    pvVar2 = std::
             vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
             ::operator[]((vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                           *)local_28,i_1);
    pdVar3 = CD_Matrix::Vector3T<double,_false>::operator[](pvVar2,2);
    *pdVar3 = dVar9;
    dVar9 = sin(0.0015);
    dVar9 = sin(dVar9 * 0.2);
    dVar9 = sin(dVar9 * 97.0 * (double)((i_1 % 0x4f) % 3));
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,i_1);
    *pvVar4 = dVar9 * 4.0;
  }
  cVar5 = clock();
  for (j = 0; (long)j < 10000; j = j + 1) {
    _j_1 = 0;
    while( true ) {
      sVar6 = sch::CD_Scene::size(&this->sObj);
      if (sVar6 <= _j_1) break;
      pSVar7 = sch::CD_Scene::operator[](&this->sObj,_j_1);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_58,j);
      std::
      vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
      ::operator[]((vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                    *)local_28,j);
      sch::S_Object::addRotation((double *)pSVar7,(Vector3T *)pvVar4);
      _j_1 = _j_1 + 1;
    }
    sch::CD_Scene::sceneProximityQuery();
    p1.m_z._4_4_ = 0;
    while( true ) {
      sVar6 = sch::CD_Scene::size(&this->sObj);
      if (sVar6 <= p1.m_z._4_4_) break;
      for (p1.m_z._0_4_ = 0; p1.m_z._0_4_ < p1.m_z._4_4_; p1.m_z._0_4_ = p1.m_z._0_4_ + 1) {
        CD_Matrix::Vector3T<double,_false>::Vector3T((Vector3T<double,_false> *)&p2.m_z);
        CD_Matrix::Vector3T<double,_false>::Vector3T((Vector3T<double,_false> *)&distance);
        sch::CD_Scene::getWitnessPoints
                  (&this->sObj,p1.m_z._4_4_,p1.m_z._0_4_,(Point3 *)&p2.m_z,(Point3 *)&distance);
      }
      p1.m_z._4_4_ = p1.m_z._4_4_ + 1;
    }
    display();
  }
  cVar8 = clock();
  poVar1 = std::operator<<((ostream *)&std::cout,"  computation time: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)(cVar8 - cVar5) / 1000000.0);
  poVar1 = std::operator<<(poVar1," : ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,((double)(cVar8 - cVar5) / 1000000.0) / 10000.0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_58);
  std::
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>::
  ~vector((vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
           *)local_28);
  return;
}

Assistant:

void TestMaterial::TestPrecision()
{
  std::cout << "TestPrecision" << std::endl;

  std::vector<Vector3> axe(AnimationEnd) ;
  std::vector<double> angle(AnimationEnd) ;

  std::cout.precision(18);

#ifdef DO_TEST
  sObj.sceneProximityQuery();
#endif

  display();

  clock_t begin, end;



#ifdef OUTPUT_FILE
  std::fstream outfile;
  outfile.open("/tmp/sch_precisiontest_result.txt",std::ios_base::out|std::ios_base::trunc);
  outfile.precision(18);
#endif


#ifdef IRREGULARITIES_COUNTERS
  Scalar previousDistance=2e90;
  int irrCpt=0;
#endif


#ifdef COLLISION_COUNTERS
  int collCpt=0;
  int totalCpt=0;
#endif



  for (long i=0; i<AnimationEnd; i++)
  {
    axe[i][0] =  sin((42)*sin(0.2*AnimationSpeed)*Scalar(i%87%3));
    axe[i][1] =  sin((-43)*sin(0.2*AnimationSpeed)*Scalar(i%73%3));
    axe[i][2] =  cos((83)*sin(0.1*AnimationSpeed)*Scalar(i%89%3));

    angle[i]=4*sin((97)*sin(0.2*sin(0.5*AnimationSpeed))*Scalar(i%79%3));

    /*sObj[j]->addTranslation(Vector3(sin((20*(1))*sin(0.2*AnimationSpeed))*(i%67%3),
    sin((71-140*(1))*sin(0.15*AnimationSpeed))*(i%59%3),
    sin((20)*sin(0.2*AnimationSpeed*(i%93%3))))*AnimationScale);
    */
  }



  begin=clock();
  for (long i=0; i<AnimationEnd; i++)
  {
    for (size_t j=0; j<sObj.size(); j++)
      sObj[j]->addRotation(angle[i],axe[i]);

#ifdef DO_TEST
    sObj.sceneProximityQuery();

    for (unsigned k=0; k<sObj.size(); k++)
    {
      for (unsigned j=0; j<k; j++)
      {
        Point3 p1,p2;
        Scalar distance=sObj.getWitnessPoints(k,j,p1,p2);
# ifndef OUTPUT_FILE
        (void) distance; ///preventing unsused variable warning
#else
        outfile<<p1<<p2<<distance<<std::endl;
# endif
      }
    }

#ifdef IRREGULARITIES_COUNTERS
    Point3 p1,p2;
    Scalar distance=sObj.getWitnessPoints(0,1,p1,p2);
    Scalar distance2=(p1-p2).normsquared();
    if (previousDistance!=2e90)
    {
      if (fabs(fabs(distance)-distance2)>(0.001*(fabs(distance)+distance2)/2))
      {
        irrCpt++;
        std::cout<<"Witness Points Irregularity : "<<i<<' '<<distance<<' '<<distance2<<std::endl;
      }
      if (fabs(distance-previousDistance)>0.1)
      {
        irrCpt++;
        std::cout<<"Coherence Irregularity : "<<i;
      }
    }
    previousDistance=distance;
#endif

#ifdef COLLISION_COUNTERS
    for (int k=0; k<sObj.size(); k++)
    {
      for (int j=0; j<k; j++)
      {
        Point3 p1,p2;
        Scalar distance=sObj.getWitnessPoints(k,j,p1,p2);
        if (distance<0)
          collCpt++;
        totalCpt++;
      }
    }
#endif

#endif


#ifdef TEST_HOLD
    std::cout<<i<<std::endl;
    system("pause");
#endif

    display();
  }

  end=clock();


#ifdef OUTPUT_FILE
  outfile.close();
#endif



  std::cout << "  computation time: " << ((double)(end- begin) / CLOCKS_PER_SEC) << " : " << ((double)(end - begin) / CLOCKS_PER_SEC)/(AnimationEnd) <<  std::endl;

#ifdef IRREGULARITIES_COUNTERS
  std::cout<<"Irregularities : "<<irrCpt<<std::endl;
#endif

#ifdef COLLISION_COUNTERS
  std::cout << "Collisions : "<<collCpt<<std::endl;
#endif
}